

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

void __thiscall QMainWindow::setDockNestingEnabled(QMainWindow *this,bool enabled)

{
  long lVar1;
  undefined7 in_register_00000031;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QMainWindowLayout::setDockOptions
            (*(QMainWindowLayout **)(lVar1 + 0x260),
             (DockOptions)
             ((*(uint *)(*(long *)(lVar1 + 0x260) + 0x700) & 0xfffffffd) +
             (int)CONCAT71(in_register_00000031,enabled) * 2));
  return;
}

Assistant:

void QMainWindow::setDockNestingEnabled(bool enabled)
{
    Q_D(QMainWindow);

    DockOptions opts = d->layout->dockOptions;
    opts.setFlag(AllowNestedDocks, enabled);

    d->layout->setDockOptions(opts);
}